

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O2

sx_job_t sx_job_dispatch(sx_job_context *ctx,int count,sx_job_cb *callback,void *user,
                        sx_job_priority priority,uint tags)

{
  sx_lock_t sVar1;
  int iVar2;
  sx_pool *psVar3;
  sx__pool_page *psVar4;
  code *pcVar5;
  int range_end;
  int iVar6;
  _Bool _Var7;
  sx_job_t puVar8;
  long *plVar9;
  sx__pool_page *psVar10;
  ulong uVar11;
  sx__pool_page *psVar12;
  sx__job *node;
  undefined4 *puVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  sx__pool_page **ppsVar17;
  long lVar18;
  uint32_t n;
  uint32_t uVar19;
  void ***__s;
  sx_job_priority *psVar20;
  int range_start;
  sx__job_pending *psVar21;
  uint uVar22;
  ulong uVar23;
  sx_job_t unaff_R15;
  bool bVar24;
  
  if (count < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x11f,"count > 0");
    pcVar5 = (code *)swi(3);
    puVar8 = (sx_job_t)(*pcVar5)();
    return puVar8;
  }
  plVar9 = (long *)sx_tls_get(ctx->thread_tls);
  if (tags == 0) {
    uVar14 = ctx->num_threads + 1;
  }
  else {
    uVar14 = 0;
    for (lVar18 = 0; lVar18 <= ctx->num_threads; lVar18 = lVar18 + 1) {
      uVar14 = (uVar14 + 1) - (uint)((ctx->tags[lVar18] & tags) == 0);
    }
  }
  iVar6 = count / (int)uVar14;
  uVar19 = (uint32_t)((long)count % (long)(int)uVar14);
  uVar23 = (long)count % (long)(int)uVar14 & 0xffffffff;
  n = 0;
  if (0 < (int)uVar19) {
    n = uVar19;
  }
  if (0 < iVar6) {
    n = uVar14;
  }
  if ((int)n < 1) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x132,"num_jobs > 0");
    pcVar5 = (code *)swi(3);
    puVar8 = (sx_job_t)(*pcVar5)();
    return puVar8;
  }
  if (ctx->job_pool->capacity < (int)n) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x134,"this amount of jobs at a time cannot be done. increase max_jobs");
    pcVar5 = (code *)swi(3);
    puVar8 = (sx_job_t)(*pcVar5)();
    return puVar8;
  }
  while( true ) {
    LOCK();
    sVar1 = ctx->counter_lk;
    ctx->counter_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->counter_lk != 0);
  }
  bVar24 = true;
  while (bVar24) {
    psVar3 = ctx->counter_pool;
    ppsVar17 = &psVar3->pages;
    while (psVar10 = *ppsVar17, psVar10 != (sx__pool_page *)0x0) {
      ppsVar17 = &psVar10->next;
      if (0 < psVar10->iter) goto LAB_0010a284;
    }
    uVar22 = psVar3->capacity;
    iVar2 = psVar3->item_sz;
    psVar10 = (sx__pool_page *)
              (*ctx->alloc->alloc_cb)
                        ((void *)0x0,((long)iVar2 + 8) * (long)(int)uVar22 + 0x20,0x10,
                         "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                         "sx_job_t sx_job_dispatch(sx_job_context *, int, sx_job_cb *, void *, sx_job_priority, unsigned int)"
                         ,0x139,ctx->alloc->user_data);
    if (psVar10 == (sx__pool_page *)0x0) {
      sx__mem_run_fail_callback
                ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h",
                 0x3e);
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0x3e,"Out of memory");
      pcVar5 = (code *)swi(3);
      puVar8 = (sx_job_t)(*pcVar5)();
      return puVar8;
    }
    psVar10->iter = uVar22;
    psVar10->ptrs = &psVar10[1].ptrs;
    __s = &psVar10[1].ptrs + (int)uVar22;
    psVar10->buff = (uint8_t *)__s;
    psVar10->next = (sx__pool_page *)0x0;
    uVar11 = 0;
    if (0 < (int)uVar22) {
      uVar11 = (ulong)uVar22;
    }
    lVar18 = 0;
    uVar15 = uVar22;
    while( true ) {
      uVar15 = uVar15 - 1;
      bVar24 = uVar11 == 0;
      uVar11 = uVar11 - 1;
      if (bVar24) break;
      psVar10->ptrs[(int)uVar15] = (void *)((long)__s + lVar18);
      __s = (void ***)psVar10->buff;
      lVar18 = lVar18 + iVar2;
    }
    memset(__s,0,(long)(int)(iVar2 * uVar22));
    psVar4 = psVar3->pages;
    do {
      psVar12 = psVar4;
      psVar4 = psVar12->next;
    } while (psVar4 != (sx__pool_page *)0x0);
    psVar12->next = psVar10;
LAB_0010a284:
    unaff_R15 = (sx_job_t)sx_pool_new(ctx->counter_pool);
    ctx->counter_lk = 0;
    bVar24 = false;
  }
  if (unaff_R15 == (sx_job_t)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x13d,"Maximum job instances exceeded");
    pcVar5 = (code *)swi(3);
    puVar8 = (sx_job_t)(*pcVar5)();
    return puVar8;
  }
  *unaff_R15 = n;
  if (plVar9 == (long *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c",
                      0x142,"Dispatch must be called within main thread or job threads");
    pcVar5 = (code *)swi(3);
    puVar8 = (sx_job_t)(*pcVar5)();
    return puVar8;
  }
  if (*plVar9 != 0) {
    *(sx_job_t *)(*plVar9 + 0x38) = unaff_R15;
  }
  while( true ) {
    LOCK();
    sVar1 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  uVar14 = 0;
  if (0 < (int)n) {
    uVar14 = n;
  }
  bVar24 = true;
  do {
    if (!bVar24) {
      return unaff_R15;
    }
    _Var7 = sx_pool_fulln(ctx->job_pool,n);
    uVar22 = (uint)uVar23;
    if (_Var7) {
      psVar21 = ctx->pending;
      if (psVar21 == (sx__job_pending *)0x0) {
        uVar16 = 0;
        uVar15 = 1;
LAB_0010a43f:
        if ((int)uVar15 < (int)uVar16) {
          uVar15 = uVar16;
        }
        uVar11 = (ulong)uVar15;
        if ((int)uVar15 < 9) {
          uVar11 = 8;
        }
        psVar20 = &psVar21[-1].priority;
        if (psVar21 == (sx__job_pending *)0x0) {
          psVar20 = (sx_job_priority *)0x0;
        }
        puVar13 = (undefined4 *)
                  (*ctx->alloc->alloc_cb)
                            (psVar20,uVar11 * 0x28 + 8,0,
                             "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                             ,"sx_job_dispatch",0x166,ctx->alloc->user_data);
        if (puVar13 == (undefined4 *)0x0) {
          sx__mem_run_fail_callback
                    ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                     ,0x6d);
          sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                            ,0x6d,"Out of memory");
          pcVar5 = (code *)swi(3);
          puVar8 = (sx_job_t)(*pcVar5)();
          return puVar8;
        }
        *puVar13 = (int)uVar11;
        if (psVar21 == (sx__job_pending *)0x0) {
          puVar13[1] = 0;
        }
        psVar21 = (sx__job_pending *)(puVar13 + 2);
        ctx->pending = psVar21;
        uVar19 = puVar13[1];
        uVar15 = uVar19 + 1;
      }
      else {
        uVar19 = psVar21[-1].tags;
        uVar15 = uVar19 + 1;
        if ((int)psVar21[-1].priority <= (int)uVar15) {
          uVar16 = psVar21[-1].priority * 2;
          goto LAB_0010a43f;
        }
      }
      psVar21[-1].tags = uVar15;
      psVar21[(int)uVar19].counter = unaff_R15;
      psVar21[(int)uVar19].range_size = iVar6;
      psVar21[(int)uVar19].range_reminder = uVar22;
      psVar21[(int)uVar19].callback = callback;
      psVar21[(int)uVar19].user = user;
      psVar21[(int)uVar19].priority = priority;
      psVar21[(int)uVar19].tags = tags;
    }
    else {
      uVar19 = 0;
      iVar2 = (uint)(0 < (int)uVar22) + iVar6;
      range_start = 0;
      while( true ) {
        range_end = iVar2;
        uVar23 = (ulong)(uVar22 - 1);
        if (uVar14 == uVar19) break;
        node = sx__new_job(ctx,uVar19,callback,user,range_start,range_end,unaff_R15,tags,priority);
        sx__job_add_list(ctx->waiting_list + priority,ctx->waiting_list_last + priority,node);
        uVar19 = uVar19 + 1;
        iVar2 = (uint)(1 < (int)uVar22) + iVar6 + range_end;
        uVar22 = uVar22 - 1;
        range_start = range_end;
      }
      if (1 < (int)uVar22) {
        sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/jobs.c"
                          ,0x158,"range_reminder <= 0");
        pcVar5 = (code *)swi(3);
        puVar8 = (sx_job_t)(*pcVar5)();
        return puVar8;
      }
      sx_semaphore_post(&ctx->sem,n);
    }
    ctx->job_lk = 0;
    bVar24 = false;
  } while( true );
}

Assistant:

sx_job_t sx_job_dispatch(sx_job_context* ctx, int count, sx_job_cb* callback, void* user,
                         sx_job_priority priority, unsigned int tags)
{
    sx_assert(count > 0);

    sx__job_thread_data* tdata = (sx__job_thread_data*)sx_tls_get(ctx->thread_tls);

    // Divide job count into ranges
    // check which threads are eligible to execute this task (based on tags)
    int num_workers = 0;
    if (tags != 0) {
        for (int i = 0, ic = ctx->num_threads + 1; i < ic; i++) {
            if (ctx->tags[i] & tags)
                num_workers++;
        }
    } else {
        num_workers = ctx->num_threads + 1;
    }

    int range_size = count / num_workers;
    int range_reminder = count % num_workers;
    int num_jobs = range_size > 0 ? num_workers : (range_reminder > 0 ? range_reminder : 0);
    sx_assert(num_jobs > 0);
    sx_assertf(num_jobs <= ctx->job_pool->capacity,
              "this amount of jobs at a time cannot be done. increase max_jobs");

    // Create a counter (job handle)
    sx_job_t counter;
    sx_lock(ctx->counter_lk) {
        counter = (sx_job_t)sx_pool_new_and_grow(ctx->counter_pool, ctx->alloc);
    }

    if (!counter) {
        sx_assertf(0, "Maximum job instances exceeded");
        return NULL;
    }

    sx_atomic_store32_explicit(counter, (uint32_t)num_jobs, SX_ATOMIC_MEMORYORDER_RELEASE);
    sx_assertf(tdata, "Dispatch must be called within main thread or job threads");

    // Another job is running on this thread. So depend the current running job to the new
    // dispatches
    if (tdata->cur_job)
        tdata->cur_job->wait_counter = counter;

    // Push jobs to the end of the list, so they can be collected by threads
    sx_lock(ctx->job_lk) {
        if (!sx_pool_fulln(ctx->job_pool, num_jobs)) {
            int range_start = 0;
            int range_end = range_size + (range_reminder > 0 ? 1 : 0);
            --range_reminder;

            for (int i = 0; i < num_jobs; i++) {
                sx__job_add_list(&ctx->waiting_list[priority], &ctx->waiting_list_last[priority],
                                 sx__new_job(ctx, i, callback, user, range_start, range_end, counter,
                                             tags, priority));
                range_start = range_end;
                range_end += (range_size + (range_reminder > 0 ? 1 : 0));
                --range_reminder;
            }
            sx_assert(range_reminder <= 0);

            // Post to semaphore to worker threads start cur_job
            sx_semaphore_post(&ctx->sem, num_jobs);
        } else {
            SX_PRAGMA_DIAGNOSTIC_PUSH()
            SX_PRAGMA_DIAGNOSTIC_IGNORED_MSVC(4204)     // nonstandard extension used: non-constant aggregate initializer
            sx__job_pending pending = { .counter = counter,
                                        .range_size = range_size,
                                        .range_reminder = range_reminder,
                                        .callback = callback,
                                        .user = user,
                                        .priority = priority,
                                        .tags = tags };
            sx_array_push(ctx->alloc, ctx->pending, pending);
            SX_PRAGMA_DIAGNOSTIC_POP()   
        }
    }   // lock

    return counter;
}